

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phi_sum.cpp
# Opt level: O1

int256_t * __thiscall
primesum::phi_sum(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int64_t a)

{
  ulong uVar1;
  long lVar2;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  int128_t *piVar3;
  _anonymous_namespace_ *this_00;
  primesum *in_RCX;
  long extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> *primes;
  primesum *ppVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  int256_t n;
  int256_t res;
  int256_t fx;
  undefined8 in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  pointer local_d0;
  primesum *local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  int128_t *local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  int256_t *local_80;
  primesum *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int256_t local_58;
  
  if (-a < (long)(ulong)((primesum *)0x7fffffffffffffff < this)) {
    if ((long)in_RCX < 10) {
      x_00._8_8_ = in_stack_ffffffffffffff20;
      x_00._0_8_ = in_stack_ffffffffffffff18;
      (anonymous_namespace)::phi_sum256<1,std::array<int,10ul>const&>
                (__return_storage_ptr__,(_anonymous_namespace_ *)this,(int128_t)x_00,a,
                 (array<int,_10UL> *)in_RCX);
    }
    else {
      local_80 = __return_storage_ptr__;
      generate_n_primes((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff20,
                        (int64_t)in_RCX);
      ppVar7 = in_RCX + 1;
      uVar5 = 0;
      lVar8 = 0;
      uVar6 = 0;
      uVar9 = 0;
      do {
        primes = (vector<int,_std::allocator<int>_> *)
                 (long)in_stack_ffffffffffffff20[(long)(ppVar7 + -1)];
        if (a < 1) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = (ulong)this / (ulong)primes;
        }
        else {
          auVar13 = __divti3(this,a,primes,(long)primes >> 0x3f);
        }
        this_00 = auVar13._0_8_;
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8 = (primesum *)0x0;
        uStack_c0 = 0;
        lVar2 = -auVar13._8_8_;
        if (lVar2 < (long)(ulong)((_anonymous_namespace_ *)0x7fffffffffffffff < this_00)) {
          x_01._8_8_ = in_stack_ffffffffffffff20;
          x_01._0_8_ = this;
          (anonymous_namespace)::phi_sum256<_1,std::vector<int,std::allocator<int>>&>
                    ((int256_t *)&local_a8,this_00,(int128_t)x_01,auVar13._8_8_,
                     (vector<int,_std::allocator<int>_> *)(ppVar7 + -2));
          local_b8 = local_98;
          uStack_b0 = uStack_90;
          local_c8 = (primesum *)local_a8;
          uStack_c0 = uStack_a0;
        }
        else {
          local_c8 = (primesum *)
                     (anonymous_namespace)::phi_sum128<_1,std::vector<int,std::allocator<int>>&>
                               ((int128_t *)this_00,(_anonymous_namespace_ *)(ppVar7 + -2),
                                (int64_t)&stack0xffffffffffffff20,
                                lVar2 - (ulong)((_anonymous_namespace_ *)0x7fffffffffffffff <
                                               this_00),primes);
          local_b8 = (long)extraout_RDX_00 >> 0x3f;
          uStack_c0 = extraout_RDX_00;
          uStack_b0 = local_b8;
        }
        local_a8 = (int128_t *)(long)in_stack_ffffffffffffff20[(long)(ppVar7 + -1)];
        uStack_a0 = (long)local_a8 >> 0x3f;
        local_98 = (ulong)(in_stack_ffffffffffffff20[(long)(ppVar7 + -1)] >> 0x1f);
        uStack_90 = local_98;
        int256_t::operator*(&local_58,(int256_t *)&local_c8,(int256_t *)&local_a8);
        bVar10 = CARRY8(uVar5,(ulong)local_58.high);
        uVar4 = uVar5 + (ulong)local_58.high;
        bVar11 = CARRY8(uVar6,(ulong)local_58.low);
        uVar6 = uVar6 + (ulong)local_58.low;
        bVar12 = CARRY8(uVar9,local_58.low._8_8_);
        uVar5 = uVar9 + local_58.low._8_8_;
        uVar9 = uVar5 + bVar11;
        uVar1 = (ulong)(bVar12 || CARRY8(uVar5,(ulong)bVar11));
        uVar5 = uVar4 + uVar1;
        lVar8 = lVar8 + local_58.high._8_8_ + (ulong)bVar10 + (ulong)CARRY8(uVar4,uVar1);
        ppVar7 = ppVar7 + -1;
      } while (1 < (long)ppVar7);
      local_b8 = a >> 0x3f;
      local_78 = this + 1;
      local_70 = a + (ulong)((primesum *)0xfffffffffffffffe < this);
      local_c8 = this;
      uStack_c0 = a;
      uStack_b0 = local_b8;
      local_68 = local_b8;
      local_60 = local_b8;
      int256_t::operator*((int256_t *)&local_a8,(int256_t *)&local_c8,(int256_t *)&local_78);
      local_58.low._8_8_ = local_98 << 0x3f | uStack_a0 >> 1;
      local_58.low._0_8_ = (ulong)local_a8 >> 1 | uStack_a0 << 0x3f;
      local_58.high._0_8_ = local_98 >> 1 | uStack_90 << 0x3f;
      local_58.high._8_8_ = uStack_90 >> 1;
      uStack_a0 = 0;
      local_98 = 0;
      local_a8 = (int128_t *)0x1;
      uStack_90 = 0;
      int256_t::operator*((int256_t *)&local_78,&local_58,(int256_t *)&local_a8);
      __return_storage_ptr__ = local_80;
      uVar1 = (ulong)(CARRY8(uVar9,local_70) ||
                     CARRY8(uVar9 + local_70,(ulong)CARRY8(uVar6,(ulong)local_78)));
      *(ulong *)((long)&local_80->low + 8) = uVar9 + local_70 + (ulong)CARRY8(uVar6,(ulong)local_78)
      ;
      *(primesum **)&local_80->low = local_78 + uVar6;
      *(ulong *)&local_80->high = uVar5 + local_68 + uVar1;
      *(ulong *)((long)&local_80->high + 8) =
           lVar8 + local_60 + (ulong)CARRY8(uVar5,local_68) + (ulong)CARRY8(uVar5 + local_68,uVar1);
      if (in_stack_ffffffffffffff20 != (pointer)0x0) {
        operator_delete(in_stack_ffffffffffffff20,(long)local_d0 - (long)in_stack_ffffffffffffff20);
      }
    }
  }
  else {
    piVar3 = phi_sum((int128_t *)this,in_RCX,a,0x7fffffffffffffff);
    *(long *)((long)&__return_storage_ptr__->low + 8) = extraout_RDX;
    *(int128_t **)&__return_storage_ptr__->low = piVar3;
    *(long *)((long)&__return_storage_ptr__->high + 8) = extraout_RDX >> 0x3f;
    *(long *)&__return_storage_ptr__->high = extraout_RDX >> 0x3f;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t phi_sum(int128_t x, int64_t a)
{
  if (x <= numeric_limits<int64_t>::max())
    return phi_sum((int64_t) x, a);

  if (a < 10)
    return phi_sum256<1>(x, a, small_primes_);
  else
    return phi_sum256<1>(x, a, generate_n_primes(a));
}